

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CheckerInstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::CheckerInstanceBodySymbol&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,CheckerInstanceBodySymbol *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  CheckerInstanceSymbol *pCVar4;
  
  pCVar4 = (CheckerInstanceSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerInstanceSymbol *)this->endPtr < pCVar4 + 1) {
    pCVar4 = (CheckerInstanceSymbol *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pCVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.kind = CheckerInstance;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar2;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.name._M_str = pcVar3;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.location = SVar1;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pCVar4->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pCVar4->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (pCVar4->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  pCVar4->body = args_2;
  (pCVar4->connections)._M_ptr = (pointer)0x0;
  (pCVar4->connections)._M_extent._M_extent_value = 0;
  pCVar4->connectionsResolved = false;
  args_2->parentInstance = pCVar4;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }